

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fluid.cxx
# Opt level: O3

void scheme_cb(Fl_Choice *param_1,void *param_2)

{
  Fl_Menu_Item *pFVar1;
  int value;
  char *s;
  
  if (batch_mode != 0) {
    return;
  }
  pFVar1 = (scheme_choice->super_Fl_Menu_).value_;
  if (pFVar1 != (Fl_Menu_Item *)0x0) {
    switch((int)((long)pFVar1 - (long)(scheme_choice->super_Fl_Menu_).menu_ >> 3) * -0x49249249) {
    case 0:
      s = (char *)0x0;
      break;
    case 1:
      s = "none";
      break;
    case 2:
      s = "plastic";
      break;
    case 3:
      s = "gtk+";
      break;
    case 4:
      s = "gleam";
      break;
    default:
      goto switchD_0019aedc_default;
    }
    Fl::scheme(s);
  }
switchD_0019aedc_default:
  pFVar1 = (scheme_choice->super_Fl_Menu_).value_;
  if (pFVar1 == (Fl_Menu_Item *)0x0) {
    value = -1;
  }
  else {
    value = (int)((ulong)((long)pFVar1 - (long)(scheme_choice->super_Fl_Menu_).menu_) >> 3) *
            -0x49249249;
  }
  Fl_Preferences::set(&fluid_prefs,"scheme",value);
  return;
}

Assistant:

void scheme_cb(Fl_Choice *, void *) {
  if (batch_mode)
    return;

  switch (scheme_choice->value()) {
    case 0 : // Default
      Fl::scheme(NULL);
      break;
    case 1 : // None
      Fl::scheme("none");
      break;
    case 2 : // Plastic
      Fl::scheme("plastic");
      break;
    case 3 : // GTK+
      Fl::scheme("gtk+");
      break;
    case 4 : // Gleam
      Fl::scheme("gleam");
      break;
  }

  fluid_prefs.set("scheme", scheme_choice->value());
}